

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::object_api<pybind11::handle>::operator()
          (object_api<pybind11::handle> *this,handle *args,handle *args_1,none *args_2,str *args_3)

{
  handle *this_00;
  object_api<pybind11::handle> *in_RSI;
  handle in_RDI;
  simple_collector<(pybind11::return_value_policy)1> *in_R8;
  PyObject *in_R9;
  handle *in_stack_ffffffffffffffb8;
  handle local_38;
  
  collect_arguments<(pybind11::return_value_policy)1,pybind11::handle,pybind11::handle,pybind11::none,pybind11::str,void>
            (in_stack_ffffffffffffffb8,&local_38,(none *)in_RDI.m_ptr,(str *)in_RSI);
  this_00 = derived(in_RSI);
  pybind11::handle::ptr(this_00);
  simple_collector<(pybind11::return_value_policy)1>::call(in_R8,in_R9);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)0x3aaafb);
  return (object)(handle)in_RDI.m_ptr;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}